

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_print.c
# Opt level: O0

int rfc5444_print_raw(autobuf *out,void *buffer,size_t length)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  uint16_t mid_len;
  uint16_t addr_length;
  uint16_t msg_size;
  uint8_t num_addr;
  uint8_t *tail;
  uint8_t *head;
  uint8_t tail_len;
  uint8_t head_len;
  ulong uStack_58;
  uint8_t flags;
  size_t i;
  size_t prefix_idx;
  size_t idx2;
  size_t idx;
  uint8_t *end;
  uint8_t *ptr;
  size_t length_local;
  void *buffer_local;
  autobuf *out_local;
  
  idx2 = 0;
  idx = (long)buffer + length;
  if (length == 0) {
    return -1;
  }
  end = (uint8_t *)buffer;
  ptr = (uint8_t *)length;
  length_local = (size_t)buffer;
  buffer_local = out;
  abuf_puts(out,"\t,------------------\n");
  abuf_puts((autobuf *)buffer_local,"\t|  PACKET\n");
  abuf_puts((autobuf *)buffer_local,"\t|------------------\n");
  bVar1 = *end;
  abuf_appendf((autobuf *)buffer_local,"\t| Packet version:    %u\n",
               (ulong)(uint)((int)(uint)bVar1 >> 4));
  abuf_appendf((autobuf *)buffer_local,"\t| Packet flags:      0x%02x\n",(ulong)(bVar1 & 0xf));
  sVar3 = idx2 + 1;
  if ((bVar1 & 8) != 0) {
    if (ptr < (uint8_t *)(idx2 + 3)) {
      return -1;
    }
    idx2 = idx2 + 1;
    abuf_appendf((autobuf *)buffer_local,"\t| Packet seq number: %u\n",(ulong)CONCAT11(*end,end[1]))
    ;
    sVar3 = idx2 + 2;
  }
  idx2 = sVar3;
  if ((bVar1 & 4) != 0) {
    if (ptr < (uint8_t *)(idx2 + 2)) {
      return -1;
    }
    iVar7 = _print_raw_tlvblock((autobuf *)buffer_local,"\t|    | ",end,&idx2,(size_t)ptr);
    if (iVar7 != 0) {
      return -1;
    }
  }
  do {
    if (ptr <= idx2) {
      return 0;
    }
    prefix_idx = idx2;
    if (ptr < (uint8_t *)(idx2 + 4)) {
      return -1;
    }
    abuf_puts((autobuf *)buffer_local,"\t|    ,-------------------\n");
    abuf_puts((autobuf *)buffer_local,"\t|    |  MESSAGE\n");
    abuf_puts((autobuf *)buffer_local,"\t|    |-------------------\n");
    abuf_appendf((autobuf *)buffer_local,"\t|    | Message type:       %u\n",(ulong)end[idx2]);
    bVar1 = end[prefix_idx + 1];
    abuf_appendf((autobuf *)buffer_local,"\t|    | Message flags:      0x%02x\n",
                 (ulong)(uint)((int)(uint)bVar1 >> 4));
    uVar4 = (bVar1 & 0xf) + 1;
    abuf_appendf((autobuf *)buffer_local,"\t|    | Address length:     %u\n",(ulong)uVar4);
    uVar5 = (ushort)end[prefix_idx + 2] * 0x100 + (ushort)end[idx2 + 3];
    abuf_appendf((autobuf *)buffer_local,"\t|    | Size:             %u\n",(ulong)uVar5);
    prefix_idx = prefix_idx + 4;
    if ((bVar1 & 0x80) != 0) {
      if (idx2 + uVar5 < prefix_idx + uVar4) {
        return -1;
      }
      abuf_appendf((autobuf *)buffer_local,"\t|    | Originator address: ");
      _print_hex((autobuf *)buffer_local,end + prefix_idx,(ulong)uVar4,(uint8_t *)idx);
      prefix_idx = uVar4 + prefix_idx;
    }
    if ((bVar1 & 0x40) != 0) {
      if (idx2 + uVar5 < prefix_idx + 1) {
        return -1;
      }
      abuf_appendf((autobuf *)buffer_local,"\t|    | Hop limit:          %u\n",
                   (ulong)end[prefix_idx]);
      prefix_idx = prefix_idx + 1;
    }
    if ((bVar1 & 0x20) != 0) {
      if (idx2 + uVar5 < prefix_idx + 1) {
        return -1;
      }
      abuf_appendf((autobuf *)buffer_local,"\t|    | Hop count:          %u\n",
                   (ulong)end[prefix_idx]);
      prefix_idx = prefix_idx + 1;
    }
    if ((bVar1 & 0x10) != 0) {
      if (idx2 + uVar5 < prefix_idx + 2) {
        return -1;
      }
      abuf_appendf((autobuf *)buffer_local,"\t|    | Sequence Number:    %u\n",
                   (ulong)CONCAT11(end[prefix_idx],end[prefix_idx + 1]));
      prefix_idx = prefix_idx + 2;
    }
    iVar7 = _print_raw_tlvblock((autobuf *)buffer_local,"\t|    |    ",end,&prefix_idx,(ulong)uVar5)
    ;
    if (iVar7 != 0) {
      return -1;
    }
    while (prefix_idx < idx2 + uVar5) {
      if (idx2 + uVar5 < prefix_idx + 2) {
        return -1;
      }
      abuf_puts((autobuf *)buffer_local,"\t|    |    ,-------------------\n");
      abuf_puts((autobuf *)buffer_local,"\t|    |    |  ADDRESS-BLOCK\n");
      abuf_puts((autobuf *)buffer_local,"\t|    |    |-------------------\n");
      bVar1 = end[prefix_idx];
      abuf_appendf((autobuf *)buffer_local,"\t|    |    | Num-Addr: %u\n",(ulong)bVar1);
      bVar2 = end[prefix_idx + 1];
      abuf_appendf((autobuf *)buffer_local,"\t|    |    | Flags:    0x%02x\n",(ulong)bVar2);
      head._5_1_ = 0;
      head._6_1_ = 0;
      tail = (uint8_t *)0x0;
      _mid_len = (uint8_t *)0x0;
      sVar3 = prefix_idx + 2;
      if ((bVar2 & 0x80) != 0) {
        if (idx2 + uVar5 < prefix_idx + 3) {
          return -1;
        }
        head._6_1_ = end[prefix_idx + 2];
        prefix_idx = prefix_idx + 3;
        if (idx2 + uVar5 < prefix_idx + head._6_1_) {
          return -1;
        }
        tail = end + prefix_idx;
        abuf_appendf((autobuf *)buffer_local,"\t|    |    | Head:     ");
        _print_hex((autobuf *)buffer_local,tail,(ulong)head._6_1_,(uint8_t *)idx);
        abuf_puts((autobuf *)buffer_local,"\n");
        sVar3 = head._6_1_ + prefix_idx;
      }
      prefix_idx = sVar3;
      if ((bVar2 & 0x40) != 0) {
        if (idx2 + uVar5 < prefix_idx + 1) {
          return -1;
        }
        head._5_1_ = end[prefix_idx];
        prefix_idx = prefix_idx + 1;
        if (idx2 + uVar5 < prefix_idx + head._5_1_) {
          return -1;
        }
        _mid_len = end + prefix_idx;
        abuf_appendf((autobuf *)buffer_local,"\t|    |    | Tail:     ");
        _print_hex((autobuf *)buffer_local,_mid_len,(ulong)head._5_1_,(uint8_t *)idx);
        abuf_puts((autobuf *)buffer_local,"\n");
        prefix_idx = head._5_1_ + prefix_idx;
      }
      if ((bVar2 & 0x20) != 0) {
        if (idx2 + uVar5 < prefix_idx + 1) {
          return -1;
        }
        head._5_1_ = end[prefix_idx];
        _mid_len = rfc5444_print_raw::ZEROTAIL;
        abuf_appendf((autobuf *)buffer_local,"\t|    |    | ZeroTail: ");
        _print_hex((autobuf *)buffer_local,rfc5444_print_raw::ZEROTAIL,(ulong)head._5_1_,
                   (uint8_t *)idx);
        abuf_puts((autobuf *)buffer_local,"\n");
        prefix_idx = prefix_idx + 1;
      }
      if (uVar4 <= (ushort)((ushort)head._6_1_ + (ushort)head._5_1_)) {
        return -1;
      }
      uVar6 = ((uVar4 - head._6_1_) - (ushort)head._5_1_) * (ushort)bVar1;
      if (idx2 + uVar5 < prefix_idx + uVar6) {
        return -1;
      }
      i = idx2 + uVar6;
      if ((bVar2 & 0x10) == 0) {
        if ((bVar2 & 8) == 0) {
          i = 0;
        }
        else if (idx2 + uVar5 < i + bVar1) {
          return -1;
        }
      }
      else if (idx2 + uVar5 < i + 1) {
        return -1;
      }
      for (uStack_58 = 0; uStack_58 < bVar1; uStack_58 = uStack_58 + 1) {
        abuf_puts((autobuf *)buffer_local,"\t|    |    |    ,-------------------\n");
        abuf_puts((autobuf *)buffer_local,"\t|    |    |    |  Address\n");
        abuf_puts((autobuf *)buffer_local,"\t|    |    |    |-------------------\n");
        abuf_appendf((autobuf *)buffer_local,"\t|    |    |    | Address: ");
        if (head._6_1_ != 0) {
          _print_hex((autobuf *)buffer_local,tail,(ulong)head._6_1_,(uint8_t *)idx);
          abuf_puts((autobuf *)buffer_local," | ");
        }
        _print_hex((autobuf *)buffer_local,end + prefix_idx,
                   (long)(int)(((uint)uVar4 - (uint)head._6_1_) - (uint)head._5_1_),(uint8_t *)idx);
        prefix_idx = (long)(int)(((uint)uVar4 - (uint)head._6_1_) - (uint)head._5_1_) + prefix_idx;
        if (head._5_1_ != 0) {
          abuf_puts((autobuf *)buffer_local," | ");
          _print_hex((autobuf *)buffer_local,_mid_len,(ulong)head._5_1_,(uint8_t *)idx);
        }
        if (i != 0) {
          abuf_appendf((autobuf *)buffer_local," / %u",(ulong)end[i]);
        }
        if ((bVar2 & 8) != 0) {
          i = i + 1;
        }
        abuf_puts((autobuf *)buffer_local,"\n");
      }
      iVar7 = _print_raw_tlvblock((autobuf *)buffer_local,"\t|    |    |    ",end,&prefix_idx,
                                  (ulong)uVar5);
      if (iVar7 != 0) {
        return -1;
      }
    }
    if (idx2 + uVar5 != prefix_idx) {
      return -1;
    }
    idx2 = prefix_idx;
  } while( true );
}

Assistant:

int
rfc5444_print_raw(struct autobuf *out, void *buffer, size_t length) {
  static uint8_t ZEROTAIL[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
  uint8_t *ptr, *end;
  size_t idx, idx2, prefix_idx, i;
  uint8_t flags, head_len, tail_len, *head, *tail, num_addr;
  uint16_t msg_size, addr_length, mid_len;

  ptr = buffer;
  idx = 0;
  end = &ptr[length];
  
  if (idx + 1 > length) {
    return -1;
  }

  abuf_puts(out, "\t,------------------\n");
  abuf_puts(out, "\t|  PACKET\n");
  abuf_puts(out, "\t|------------------\n");

  flags = ptr[0];
  abuf_appendf(out, "\t| Packet version:    %u\n", flags >> 4);
  abuf_appendf(out, "\t| Packet flags:      0x%02x\n", flags & 0x0f);
  idx++;

  if (flags & RFC5444_PKT_FLAG_SEQNO) {
    if (idx + 2 > length) {
      return -1;
    }

    abuf_appendf(out, "\t| Packet seq number: %u\n", (ptr[0] << 8) | ptr[1]);
    idx += 2;
  }

  if (flags & RFC5444_PKT_FLAG_TLV) {
    if (idx + 2 > length) {
      return -1;
    }
    if (_print_raw_tlvblock(out, "\t|    | ", ptr, &idx, length)) {
      return -1;
    }
  }

  while (idx < length) {
    idx2 = idx;

    /* print messages */
    if (idx2 + 4 > length) {
      return -1;
    }

    abuf_puts(out, "\t|    ,-------------------\n");
    abuf_puts(out, "\t|    |  MESSAGE\n");
    abuf_puts(out, "\t|    |-------------------\n");
    abuf_appendf(out, "\t|    | Message type:       %u\n", ptr[idx]);

    flags = ptr[idx2 + 1];
    abuf_appendf(out, "\t|    | Message flags:      0x%02x\n", flags >> 4);

    addr_length = (flags & 15) + 1;
    abuf_appendf(out, "\t|    | Address length:     %u\n", addr_length);

    msg_size = (ptr[idx2 + 2] << 8) + ptr[idx + 3];
    abuf_appendf(out, "\t|    | Size:             %u\n", msg_size);
    idx2 += 4;

    if (flags & RFC5444_MSG_FLAG_ORIGINATOR) {
      if (idx2 + addr_length > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Originator address: ");
      _print_hex(out, &ptr[idx2], addr_length, end);
      idx2 += addr_length;
    }
    if (flags & RFC5444_MSG_FLAG_HOPLIMIT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop limit:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_HOPCOUNT) {
      if (idx2 + 1 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Hop count:          %u\n", ptr[idx2]);
      idx2++;
    }
    if (flags & RFC5444_MSG_FLAG_SEQNO) {
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }
      abuf_appendf(out, "\t|    | Sequence Number:    %u\n", (ptr[idx2] << 8) | ptr[idx2 + 1]);
      idx2 += 2;
    }

    if (_print_raw_tlvblock(out, "\t|    |    ", ptr, &idx2, msg_size)) {
      return -1;
    }

    while (idx2 < idx + msg_size) {
      /* print address blocks */
      if (idx2 + 2 > idx + msg_size) {
        return -1;
      }

      abuf_puts(out, "\t|    |    ,-------------------\n");
      abuf_puts(out, "\t|    |    |  ADDRESS-BLOCK\n");
      abuf_puts(out, "\t|    |    |-------------------\n");

      num_addr = ptr[idx2];
      abuf_appendf(out, "\t|    |    | Num-Addr: %u\n", num_addr);

      flags = ptr[idx2 + 1];
      abuf_appendf(out, "\t|    |    | Flags:    0x%02x\n", flags);

      idx2 += 2;

      head_len = tail_len = 0;
      head = NULL;
      tail = NULL;
      if (flags & RFC5444_ADDR_FLAG_HEAD) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        head_len = ptr[idx2];
        idx2++;
        if (idx2 + head_len > idx + msg_size) {
          return -1;
        }

        head = &ptr[idx2];

        abuf_appendf(out, "\t|    |    | Head:     ");
        _print_hex(out, head, head_len, end);
        abuf_puts(out, "\n");

        idx2 += head_len;
      }
      if (flags & RFC5444_ADDR_FLAG_FULLTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];
        idx2++;
        if (idx2 + tail_len > idx + msg_size) {
          return -1;
        }

        tail = &ptr[idx2];
        abuf_appendf(out, "\t|    |    | Tail:     ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");
        idx2 += tail_len;
      }
      if (flags & RFC5444_ADDR_FLAG_ZEROTAIL) {
        if (idx2 + 1 > idx + msg_size) {
          return -1;
        }

        tail_len = ptr[idx2];

        tail = ZEROTAIL;
        abuf_appendf(out, "\t|    |    | ZeroTail: ");
        _print_hex(out, tail, tail_len, end);
        abuf_puts(out, "\n");

        idx2++;
      }

      if (head_len + tail_len >= addr_length) {
        return -1;
      }

      mid_len = (addr_length - head_len - tail_len) * num_addr;
      if (idx2 + mid_len > idx + msg_size) {
        return -1;
      }

      prefix_idx = idx + mid_len;
      if (flags & RFC5444_ADDR_FLAG_SINGLEPLEN) {
        if (prefix_idx + 1 > idx + msg_size) {
          return -1;
        }
      }
      else if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
        if (prefix_idx + num_addr > idx + msg_size) {
          return -1;
        }
      }
      else {
        prefix_idx = 0;
      }

      for (i = 0; i < num_addr; i++) {
        abuf_puts(out, "\t|    |    |    ,-------------------\n");
        abuf_puts(out, "\t|    |    |    |  Address\n");
        abuf_puts(out, "\t|    |    |    |-------------------\n");

        abuf_appendf(out, "\t|    |    |    | Address: ");

        if (head_len) {
          _print_hex(out, head, head_len, end);

          abuf_puts(out, " | ");
        }
        _print_hex(out, &ptr[idx2], addr_length - head_len - tail_len, end);
        idx2 += addr_length - head_len - tail_len;

        if (tail_len) {
          abuf_puts(out, " | ");

          _print_hex(out, tail, tail_len, end);
        }

        if (prefix_idx) {
          abuf_appendf(out, " / %u", ptr[prefix_idx]);
        }
        if (flags & RFC5444_ADDR_FLAG_MULTIPLEN) {
          prefix_idx++;
        }

        abuf_puts(out, "\n");
      }

      if (_print_raw_tlvblock(out, "\t|    |    |    ", ptr, &idx2, msg_size)) {
        return -1;
      }
    }

    if (idx + msg_size != idx2) {
      return -1;
    }

    idx = idx2;
  }

  return 0;
}